

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_file_system.cpp
# Opt level: O2

void __thiscall
duckdb::ZstdStreamWrapper::Write
          (ZstdStreamWrapper *this,CompressedFile *file,StreamData *sd,data_ptr_t uncompressed_data,
          int64_t uncompressed_size)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  data_ptr_t pdVar2;
  size_t sVar3;
  uint uVar4;
  size_t code;
  pointer pFVar5;
  IOException *this_00;
  char *pcVar6;
  allocator local_89;
  CompressedFile *local_88;
  ZSTD_outBuffer out_buffer;
  ZSTD_inBuffer in_buffer;
  string local_50 [32];
  
  local_88 = file + 0x48;
  while( true ) {
    if (uncompressed_size < 1) {
      return;
    }
    out_buffer.dst = sd->out_buff_start;
    in_buffer.pos = 0;
    out_buffer.size =
         (long)(sd->out_buff).
               super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
         (sd->out_buf_size - (long)out_buffer.dst);
    out_buffer.pos = 0;
    in_buffer.src = uncompressed_data;
    in_buffer.size = uncompressed_size;
    code = duckdb_zstd::ZSTD_compressStream2
                     (this->zstd_compress_ptr,&out_buffer,&in_buffer,ZSTD_e_continue);
    uVar4 = duckdb_zstd::ZSTD_isError(code);
    sVar3 = in_buffer.pos;
    if (uVar4 != 0) break;
    _Var1._M_head_impl =
         (sd->out_buff).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
         _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    pdVar2 = sd->out_buff_start;
    sd->out_buff_start = pdVar2 + out_buffer.pos;
    if (pdVar2 + out_buffer.pos == _Var1._M_head_impl + sd->out_buf_size) {
      pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                           *)local_88);
      duckdb::FileHandle::Write
                (pFVar5,(ulong)(sd->out_buff).
                               super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      sd->out_buff_start =
           (sd->out_buff).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
           _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
    uncompressed_data = uncompressed_data + sVar3;
    uncompressed_size = uncompressed_size - sVar3;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  pcVar6 = duckdb_zstd::ZSTD_getErrorName(code);
  std::__cxx11::string::string(local_50,pcVar6,&local_89);
  duckdb::IOException::IOException(this_00,local_50);
  __cxa_throw(this_00,&IOException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ZstdStreamWrapper::Write(CompressedFile &file, StreamData &sd, data_ptr_t uncompressed_data,
                              int64_t uncompressed_size) {
	D_ASSERT(writing);

	auto remaining = uncompressed_size;
	while (remaining > 0) {
		D_ASSERT(sd.out_buff.get() + sd.out_buf_size > sd.out_buff_start);
		idx_t output_remaining = (sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_start;

		duckdb_zstd::ZSTD_inBuffer in_buffer;
		duckdb_zstd::ZSTD_outBuffer out_buffer;

		in_buffer.src = uncompressed_data;
		in_buffer.size = remaining;
		in_buffer.pos = 0;

		out_buffer.dst = sd.out_buff_start;
		out_buffer.size = output_remaining;
		out_buffer.pos = 0;
		auto res =
		    duckdb_zstd::ZSTD_compressStream2(zstd_compress_ptr, &out_buffer, &in_buffer, duckdb_zstd::ZSTD_e_continue);
		if (duckdb_zstd::ZSTD_isError(res)) {
			throw IOException(duckdb_zstd::ZSTD_getErrorName(res));
		}
		idx_t input_consumed = in_buffer.pos;
		idx_t written_to_output = out_buffer.pos;
		sd.out_buff_start += written_to_output;
		if (sd.out_buff_start == sd.out_buff.get() + sd.out_buf_size) {
			// no more output buffer available: flush
			file.child_handle->Write(sd.out_buff.get(), sd.out_buff_start - sd.out_buff.get());
			sd.out_buff_start = sd.out_buff.get();
		}
		uncompressed_data += input_consumed;
		remaining -= UnsafeNumericCast<int64_t>(input_consumed);
	}
}